

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O1

void anon_unknown.dwarf_31ecc4::writeRead
               (string *tempDir,int W,int H,Compression comp,int xSize,int ySize)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  undefined4 *puVar11;
  Compression *pCVar12;
  Rgba *pRVar13;
  int *piVar14;
  void *pvVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  float *pfVar18;
  Rgba *pRVar19;
  ulong uVar20;
  ulong *puVar21;
  void *pvVar22;
  ulong uVar23;
  Rgba RVar24;
  Array2D<Imf_3_2::Rgba> *pAVar25;
  Array2D<Imf_3_2::Rgba> *pAVar26;
  long lVar27;
  half *phVar28;
  long lVar29;
  ulong uVar30;
  Rgba RVar31;
  int xlevel;
  uint width;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  Array2D<Imf_3_2::Rgba> *pAVar36;
  Rgba *pRVar37;
  uint uVar38;
  ulong uVar39;
  void *pvVar40;
  long lVar41;
  long lVar42;
  bool bVar43;
  undefined4 uVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  undefined1 auStack_208 [8];
  Rgba *local_200;
  uint local_1f4;
  Array2D<Imf_3_2::Rgba> *local_1f0;
  Array2D<Imf_3_2::Rgba> *local_1e8;
  ulong *local_1e0;
  int local_1d8;
  int local_1d4;
  TiledRgbaOutputFile out;
  half hStack_1ce;
  half hStack_1cc;
  half hStack_1ca;
  Array2D<Imf_3_2::Rgba> p1;
  Array2D<Imf_3_2::Rgba> p3;
  Header header;
  Compression local_e8;
  Compression local_d8;
  Rgba *local_d0;
  int local_c0;
  void *local_b8;
  Rgba *local_b0;
  long local_a8;
  undefined1 local_98 [8];
  long local_90;
  Rgba *local_88;
  int local_7c;
  string filename;
  
  local_1e0 = (ulong *)CONCAT44(local_1e0._4_4_,ySize);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  local_1f4 = xSize;
  local_1d8 = W;
  local_1d4 = H;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  _Var5 = filename._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", compression ",0xe);
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", tileSize ",0xb);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1f4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
  plVar10 = (long *)std::ostream::operator<<(poVar9,(int)local_1e0);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  _out = 0;
  hStack_1ce._h = 0;
  hStack_1cc._h = 0;
  hStack_1ca._h = 0;
  Imf_3_2::Header::Header
            (&header,local_1d8,local_1d4,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
  *puVar11 = 0;
  pCVar12 = (Compression *)Imf_3_2::Header::compression();
  *pCVar12 = comp;
  p1._sizeX = (long)local_1d4;
  lVar41 = (long)local_1d8;
  p1._sizeY = lVar41;
  pRVar13 = (Rgba *)operator_new__(-(ulong)((ulong)(p1._sizeX * lVar41) >> 0x3d != 0) |
                                   p1._sizeX * lVar41 * 8);
  p1._data = pRVar13;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
  std::ostream::flush();
  remove(_Var5._M_p);
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,_Var5._M_p,&header,WRITE_RGBA,local_1f4,(int)local_1e0,ONE_LEVEL,ROUND_DOWN,iVar6)
  ;
  fillPixels(&p1,local_1d8,local_1d4);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar13,1);
  iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar7 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar6 + -1,0,iVar7 + -1);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var5._M_p,iVar6);
  piVar14 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  iVar6 = *piVar14;
  lVar32 = (long)piVar14[2] - (long)iVar6;
  uVar20 = lVar32 + 1;
  iVar7 = piVar14[1];
  uVar38 = piVar14[3] - iVar7;
  iVar8 = uVar38 + 1;
  uVar39 = 0xffffffffffffffff;
  if ((long)iVar8 * uVar20 < 0x2000000000000000) {
    uVar39 = (long)iVar8 * uVar20 * 8;
  }
  pvVar15 = operator_new__(uVar39);
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(long)pvVar15 + (long)iVar6 * -8 + (long)-iVar7 * uVar20 * 8,1);
  iVar6 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&out);
  iVar7 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&out);
  uVar44 = 0;
  Imf_3_2::TiledRgbaInputFile::readTiles((int)&out,0,iVar6 + -1,0,iVar7 + -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::ostream::flush();
  puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
  puVar17 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar6 = -(uint)((int)*puVar17 == (int)*puVar16);
  iVar7 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
  auVar46._4_4_ = iVar6;
  auVar46._0_4_ = iVar6;
  auVar46._8_4_ = iVar7;
  auVar46._12_4_ = iVar7;
  iVar6 = movmskpd(uVar44,auVar46);
  if ((iVar6 != 3) ||
     (iVar7 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
     iVar58 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
     auVar47._4_4_ = iVar7, auVar47._0_4_ = iVar7, auVar47._8_4_ = iVar58, auVar47._12_4_ = iVar58,
     iVar7 = movmskpd((int)puVar17,auVar47), iVar7 != 3)) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x66,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar7 = -(uint)((int)*puVar17 == (int)*puVar16);
  iVar58 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
  auVar48._4_4_ = iVar7;
  auVar48._0_4_ = iVar7;
  auVar48._8_4_ = iVar58;
  auVar48._12_4_ = iVar58;
  iVar6 = movmskpd(iVar6,auVar48);
  if ((iVar6 != 3) ||
     (iVar6 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
     iVar7 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
     auVar49._4_4_ = iVar6, auVar49._0_4_ = iVar6, auVar49._8_4_ = iVar7, auVar49._12_4_ = iVar7,
     iVar6 = movmskpd((int)puVar17,auVar49), iVar6 != 3)) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x67,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  local_200._0_4_ = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
  pfVar18 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((local_200._0_4_ != *pfVar18) || (NAN(local_200._0_4_) || NAN(*pfVar18))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x68,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
  pfVar18 = (float *)Imf_3_2::Header::screenWindowCenter();
  if (((float)p3._sizeX == *pfVar18) && (!NAN((float)p3._sizeX) && !NAN(*pfVar18))) {
    if ((p3._sizeX._4_4_ == pfVar18[1]) && (!NAN(p3._sizeX._4_4_) && !NAN(pfVar18[1]))) {
      uVar44 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
      local_200 = (Rgba *)CONCAT44(local_200._4_4_,uVar44);
      pfVar18 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((local_200._0_4_ != *pfVar18) || (NAN(local_200._0_4_) || NAN(*pfVar18))) {
        __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6a,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::lineOrder();
      piVar14 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar6 != *piVar14) {
        __assert_fail("in.lineOrder () == header.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6b,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::compression();
      piVar14 = (int *)Imf_3_2::Header::compression();
      if (iVar6 != *piVar14) {
        __assert_fail("in.compression () == header.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6c,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::channels();
      if (iVar6 != 0xf) {
        __assert_fail("in.channels () == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6d,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      local_c0 = (int)lVar32;
      if (comp - B44_COMPRESSION < 4) {
        if (-1 < (int)uVar38) {
          local_d8 = comp & ~RLE_COMPRESSION;
          local_e8 = comp & (DWAA_COMPRESSION|B44_COMPRESSION);
          lVar27 = (long)(int)local_1f4;
          lVar32 = (long)(int)local_1e0;
          local_a8 = 0;
          iVar6 = iVar8;
          local_b8 = pvVar15;
          local_b0 = pRVar13;
          do {
            iVar7 = iVar6;
            if ((int)local_1e0 < iVar6) {
              iVar7 = (int)local_1e0;
            }
            local_7c = iVar6;
            if (-1 < local_c0) {
              iVar6 = iVar8 - (int)local_a8;
              if ((int)local_1e0 <= iVar8 - (int)local_a8) {
                iVar6 = (int)local_1e0;
              }
              lVar33 = (long)iVar6;
              uVar39 = uVar20 & 0xffffffff;
              pAVar36 = (Array2D<Imf_3_2::Rgba> *)0x0;
              pvVar40 = local_b8;
              pRVar37 = local_b0;
              do {
                iVar58 = (int)uVar39;
                lVar29 = (long)iVar58;
                if (lVar27 < iVar58) {
                  lVar29 = lVar27;
                }
                width = (int)uVar20 - (int)pAVar36;
                if ((int)local_1f4 <= (int)width) {
                  width = local_1f4;
                }
                lVar42 = (long)(int)width;
                uVar39 = lVar42 * lVar33 * 8;
                if (0x1fffffffffffffff < (ulong)(lVar42 * lVar33)) {
                  uVar39 = 0xffffffffffffffff;
                }
                local_200 = pRVar37;
                local_1f0 = (Array2D<Imf_3_2::Rgba> *)pvVar40;
                local_1e8 = pAVar36;
                p3._sizeX = lVar33;
                p3._sizeY = lVar42;
                p3._data = (Rgba *)operator_new__(uVar39);
                local_98 = (undefined1  [8])lVar33;
                local_90 = lVar42;
                local_88 = (Rgba *)operator_new__(uVar39);
                pAVar36 = local_1e8;
                pAVar26 = local_1f0;
                pRVar37 = local_200;
                if (0 < iVar6) {
                  lVar42 = 0;
                  lVar34 = 0;
                  pRVar19 = local_200;
                  pAVar25 = local_1f0;
                  do {
                    if (0 < (int)width) {
                      lVar35 = 0;
                      do {
                        *(Rgba *)((long)&p3._data[lVar35].r._h + p3._sizeY * lVar42) =
                             pRVar19[lVar35];
                        *(undefined8 *)((long)&local_88[lVar35].r._h + local_90 * lVar42) =
                             *(undefined8 *)((long)pAVar25 + lVar35 * 8);
                        lVar35 = lVar35 + 1;
                      } while (lVar29 != lVar35);
                    }
                    lVar34 = lVar34 + 1;
                    lVar42 = lVar42 + 8;
                    pAVar25 = (Array2D<Imf_3_2::Rgba> *)((long)pAVar25 + uVar20 * 8);
                    pRVar19 = pRVar19 + lVar41;
                  } while (lVar34 != iVar7);
                }
                if (local_d8 == B44_COMPRESSION) {
                  compareB44(width,iVar6,&p3,(Array2D<Imf_3_2::Rgba> *)local_98,WRITE_RGBA);
                  pAVar36 = local_1e8;
                }
                else if (local_e8 == DWAA_COMPRESSION) {
                  compareDwa(width,iVar6,&p3,(Array2D<Imf_3_2::Rgba> *)local_98,WRITE_RGBA);
                }
                if (local_88 != (Rgba *)0x0) {
                  operator_delete__(local_88);
                }
                if (p3._data != (Rgba *)0x0) {
                  operator_delete__(p3._data);
                }
                pAVar36 = (Array2D<Imf_3_2::Rgba> *)((long)&pAVar36->_sizeX + lVar27);
                uVar39 = (ulong)(iVar58 - local_1f4);
                pvVar40 = (void *)((long)pAVar26 + lVar27 * 8);
                pRVar37 = pRVar37 + lVar27;
              } while ((long)pAVar36 <= (long)local_c0);
            }
            local_a8 = local_a8 + lVar32;
            iVar6 = local_7c - (int)local_1e0;
            local_b8 = (void *)((long)local_b8 + lVar32 * uVar20 * 8);
            local_b0 = local_b0 + lVar32 * lVar41;
          } while (local_a8 <= (long)(ulong)uVar38);
        }
      }
      else if (-1 < (int)uVar38) {
        phVar28 = &pRVar13->a;
        lVar32 = (long)pvVar15 + 6;
        uVar39 = 0;
        do {
          if (-1 < local_c0) {
            uVar30 = 0;
            do {
              fVar45 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -6 + uVar30 * 8) * 4);
              pfVar18 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar28[uVar30 * 4 + -3]._h * 4);
              if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x98,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar45 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -4 + uVar30 * 8) * 4);
              pfVar18 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar28[uVar30 * 4 + -2]._h * 4);
              if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x9d,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar45 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -2 + uVar30 * 8) * 4);
              pfVar18 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar28[uVar30 * 4 + -1]._h * 4);
              if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0xa2,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar45 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + uVar30 * 8) * 4);
              pfVar18 = (float *)(_imath_half_to_float_table + (ulong)phVar28[uVar30 * 4]._h * 4);
              if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0xa7,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              uVar30 = uVar30 + 1;
            } while ((uVar20 & 0xffffffff) != uVar30);
          }
          uVar39 = uVar39 + 1;
          phVar28 = phVar28 + lVar41 * 4;
          lVar32 = lVar32 + uVar20 * 8;
        } while (uVar39 != uVar38 + 1);
      }
      operator_delete__(pvVar15);
      Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
      remove(_Var5._M_p);
      operator_delete__(pRVar13);
      Imf_3_2::Header::~Header(&header);
      _Var5 = filename._M_dataplus;
      if (0xfffffffb < comp - NUM_COMPRESSION_METHODS) {
LAB_001b6afe:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", compression ",0xe)
      ;
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", tileSize ",0xb);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1f4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
      plVar10 = (long *)std::ostream::operator<<(poVar9,(int)local_1e0);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      _out = 0;
      hStack_1ce._h = 0;
      hStack_1cc._h = 0;
      hStack_1ca._h = 0;
      Imf_3_2::Header::Header
                (&header,local_1d8,local_1d4,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar11 = 0;
      pCVar12 = (Compression *)Imf_3_2::Header::compression();
      *pCVar12 = comp;
      p1._sizeX = 0;
      p1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var5._M_p);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                (&out,_Var5._M_p,&header,WRITE_RGBA,local_1f4,(int)local_1e0,MIPMAP_LEVELS,
                 ROUND_DOWN,iVar6);
      iVar6 = Imf_3_2::TiledRgbaOutputFile::numLevels();
      uVar30 = (ulong)iVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar30;
      uVar20 = SUB168(auVar2 * ZEXT816(0x18),0);
      uVar39 = uVar20 + 8;
      if (0xfffffffffffffff7 < uVar20) {
        uVar39 = 0xffffffffffffffff;
      }
      uVar20 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
        uVar20 = uVar39;
      }
      puVar21 = (ulong *)operator_new__(uVar20);
      local_1e8 = (Array2D<Imf_3_2::Rgba> *)_Var5._M_p;
      *puVar21 = uVar30;
      if (iVar6 != 0) {
        memset(puVar21 + 1,0,((uVar30 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      if (p1._sizeY != 0) {
        lVar32 = *(long *)(p1._sizeY + -8);
        pvVar15 = (void *)(p1._sizeY + -8);
        if (lVar32 != 0) {
          lVar41 = lVar32 * 0x18;
          do {
            pvVar40 = *(void **)((long)pvVar15 + lVar41);
            if (pvVar40 != (void *)0x0) {
              operator_delete__(pvVar40);
            }
            lVar41 = lVar41 + -0x18;
          } while (lVar41 != 0);
        }
        operator_delete__(pvVar15,lVar32 * 0x18 + 8);
      }
      local_200 = (Rgba *)0x0;
      pvVar15 = (void *)0x0;
      p1._sizeX = uVar30;
      p1._sizeY = (long)(puVar21 + 1);
      while (iVar6 = Imf_3_2::TiledRgbaOutputFile::numLevels(), pAVar36 = local_1e8,
            (long)pvVar15 < (long)iVar6) {
        iVar8 = (int)(Rgba *)&out;
        iVar6 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar8);
        iVar7 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar8);
        lVar32 = p1._sizeY;
        uVar39 = (long)iVar7 * (long)iVar6;
        uVar20 = uVar39 * 8;
        if (0x1fffffffffffffff < uVar39) {
          uVar20 = 0xffffffffffffffff;
        }
        pvVar22 = operator_new__(uVar20);
        pvVar40 = *(void **)(lVar32 + 0x10 + (long)local_200);
        local_1f0 = (Array2D<Imf_3_2::Rgba> *)pvVar15;
        if (pvVar40 != (void *)0x0) {
          operator_delete__(pvVar40);
        }
        pRVar13 = local_200;
        *(long *)(lVar32 + (long)local_200) = (long)iVar7;
        *(long *)(lVar32 + 8 + (long)local_200) = (long)iVar6;
        *(void **)(lVar32 + 0x10 + (long)local_200) = pvVar22;
        fillPixels((Array2D<Imf_3_2::Rgba> *)(p1._sizeY + (long)local_200),iVar6,iVar7);
        Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                  ((Rgba *)&out,*(ulong *)(p1._sizeY + 0x10 + (long)pRVar13),1);
        pAVar36 = local_1f0;
        iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar8);
        iVar7 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar8);
        Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar8,0,iVar6 + -1,0,iVar7 + -1);
        local_200 = (Rgba *)((long)local_200 + 0x18);
        pvVar15 = (void *)((long)pAVar36 + 1);
      }
      Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&out,(char *)pAVar36,iVar6);
      piVar14 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
      lVar32 = (long)*piVar14;
      iVar6 = piVar14[1];
      local_200 = (Rgba *)lVar32;
      uVar38 = Imf_3_2::TiledRgbaInputFile::numLevels();
      uVar44 = (undefined4)lVar32;
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::Array
                ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p3,(long)(int)uVar38);
      local_1f0 = (Array2D<Imf_3_2::Rgba> *)(ulong)uVar38;
      if (0 < (int)uVar38) {
        local_200 = (Rgba *)-(long)local_200;
        lVar32 = 0x10;
        uVar20 = 0;
        do {
          iVar8 = (int)auStack_208 + 0x38;
          iVar7 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar8);
          iVar8 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar8);
          lVar41 = p3._sizeY;
          uVar30 = (long)iVar8 * (long)iVar7;
          uVar39 = uVar30 * 8;
          if (0x1fffffffffffffff < uVar30) {
            uVar39 = 0xffffffffffffffff;
          }
          pvVar15 = operator_new__(uVar39);
          if (*(void **)(lVar41 + lVar32) != (void *)0x0) {
            operator_delete__(*(void **)(lVar41 + lVar32));
          }
          *(long *)(lVar41 + -0x10 + lVar32) = (long)iVar8;
          *(long *)(lVar41 + -8 + lVar32) = (long)iVar7;
          *(void **)(lVar41 + lVar32) = pvVar15;
          Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                    ((Rgba *)&out,
                     *(long *)(p3._sizeY + -8 + lVar32) * -(long)iVar6 * 8 +
                     *(long *)(p3._sizeY + lVar32) + (long)local_200 * 8,1);
          iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&out);
          iVar8 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&out);
          uVar44 = 0;
          Imf_3_2::TiledRgbaInputFile::readTiles((int)&out,0,iVar7 + -1,0,iVar8 + -1);
          uVar20 = uVar20 + 1;
          lVar32 = lVar32 + 0x18;
        } while (local_1f0 != (Array2D<Imf_3_2::Rgba> *)uVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
      puVar17 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar6 = -(uint)((int)*puVar17 == (int)*puVar16);
      iVar7 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
      auVar50._4_4_ = iVar6;
      auVar50._0_4_ = iVar6;
      auVar50._8_4_ = iVar7;
      auVar50._12_4_ = iVar7;
      iVar6 = movmskpd(uVar44,auVar50);
      if ((iVar6 != 3) ||
         (iVar7 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
         iVar8 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
         auVar51._4_4_ = iVar7, auVar51._0_4_ = iVar7, auVar51._8_4_ = iVar8, auVar51._12_4_ = iVar8
         , iVar7 = movmskpd((int)puVar17,auVar51), iVar7 != 3)) {
        __assert_fail("in.displayWindow () == header.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x103,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
      puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar7 = -(uint)((int)*puVar17 == (int)*puVar16);
      iVar8 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
      auVar52._4_4_ = iVar7;
      auVar52._0_4_ = iVar7;
      auVar52._8_4_ = iVar8;
      auVar52._12_4_ = iVar8;
      iVar6 = movmskpd(iVar6,auVar52);
      if ((iVar6 != 3) ||
         (iVar6 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
         iVar7 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
         auVar53._4_4_ = iVar6, auVar53._0_4_ = iVar6, auVar53._8_4_ = iVar7, auVar53._12_4_ = iVar7
         , iVar6 = movmskpd((int)puVar17,auVar53), iVar6 != 3)) {
        __assert_fail("in.dataWindow () == header.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x104,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      fVar45 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
      local_200._0_4_ = fVar45;
      pfVar18 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((local_200._0_4_ != *pfVar18) || (NAN(local_200._0_4_) || NAN(*pfVar18))) {
        __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x105,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
      pfVar18 = (float *)Imf_3_2::Header::screenWindowCenter();
      if (((float)local_98._0_4_ == *pfVar18) && (!NAN((float)local_98._0_4_) && !NAN(*pfVar18))) {
        if (((float)local_98._4_4_ == pfVar18[1]) &&
           (!NAN((float)local_98._4_4_) && !NAN(pfVar18[1]))) {
          uVar44 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
          local_200 = (Rgba *)CONCAT44(local_200._4_4_,uVar44);
          pfVar18 = (float *)Imf_3_2::Header::screenWindowWidth();
          if ((local_200._0_4_ != *pfVar18) || (NAN(local_200._0_4_) || NAN(*pfVar18))) {
            __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x107,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar6 = Imf_3_2::TiledRgbaInputFile::lineOrder();
          piVar14 = (int *)Imf_3_2::Header::lineOrder();
          if (iVar6 != *piVar14) {
            __assert_fail("in.lineOrder () == header.lineOrder ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x108,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar6 = Imf_3_2::TiledRgbaInputFile::compression();
          piVar14 = (int *)Imf_3_2::Header::compression();
          if (iVar6 != *piVar14) {
            __assert_fail("in.compression () == header.compression ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x109,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar6 = Imf_3_2::TiledRgbaInputFile::channels();
          if (iVar6 != 0xf) {
            __assert_fail("in.channels () == channels",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x10a,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          if (0 < (int)uVar38) {
            uVar20 = 0;
            do {
              lVar32 = uVar20 * 0x18;
              lVar27 = 0;
              lVar41 = 0;
              while( true ) {
                iVar6 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                if (iVar6 <= lVar41) break;
                lVar33 = 0;
                local_200 = (Rgba *)lVar41;
                while (iVar6 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out), lVar33 < iVar6) {
                  lVar41 = *(long *)(p3._sizeY + 8 + lVar32) * lVar27 +
                           *(long *)(p3._sizeY + 0x10 + lVar32);
                  fVar45 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar41 + lVar33 * 8) * 4);
                  lVar29 = *(long *)(p1._sizeY + 8 + lVar32) * lVar27 +
                           *(long *)(p1._sizeY + 0x10 + lVar32);
                  pfVar18 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar29 + lVar33 * 8) * 4);
                  if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                    __assert_fail("(levels2[l])[y][x].r == (levels[l])[y][x].r",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x113,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar45 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar41 + 2 + lVar33 * 8) * 4);
                  pfVar18 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar29 + 2 + lVar33 * 8) * 4);
                  if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                    __assert_fail("(levels2[l])[y][x].g == (levels[l])[y][x].g",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x118,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar45 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar41 + 4 + lVar33 * 8) * 4);
                  pfVar18 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar29 + 4 + lVar33 * 8) * 4);
                  if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                    __assert_fail("(levels2[l])[y][x].b == (levels[l])[y][x].b",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x11d,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar45 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar41 + 6 + lVar33 * 8) * 4);
                  lVar41 = lVar33 * 8;
                  lVar33 = lVar33 + 1;
                  pfVar18 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar29 + 6 + lVar41) * 4);
                  if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                    __assert_fail("(levels2[l])[y][x].a == (levels[l])[y][x].a",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x122,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                }
                lVar41 = (long)local_200 + 1;
                lVar27 = lVar27 + 8;
              }
              uVar20 = uVar20 + 1;
            } while ((Array2D<Imf_3_2::Rgba> *)uVar20 != local_1f0);
          }
          Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                    ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p3);
          Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
          remove((char *)local_1e8);
          Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                    ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1);
          Imf_3_2::Header::~Header(&header);
          _Var5 = filename._M_dataplus;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"levelMode 2",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,", compression ",0xe);
          poVar9 = (ostream *)std::ostream::operator<<(&std::cout,comp);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", tileSize ",0xb);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1f4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
          plVar10 = (long *)std::ostream::operator<<(poVar9,(int)local_1e0);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          _out = 0;
          hStack_1ce._h = 0;
          hStack_1cc._h = 0;
          hStack_1ca._h = 0;
          Imf_3_2::Header::Header
                    (&header,local_1d8,local_1d4,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
          puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
          *puVar11 = 0;
          pCVar12 = (Compression *)Imf_3_2::Header::compression();
          *pCVar12 = comp;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
          std::ostream::flush();
          remove(_Var5._M_p);
          iVar6 = Imf_3_2::globalThreadCount();
          Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                    (&out,_Var5._M_p,&header,WRITE_RGBA,local_1f4,(int)local_1e0,RIPMAP_LEVELS,
                     ROUND_UP,iVar6);
          iVar6 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
          iVar7 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
          lVar32 = (long)iVar7;
          uVar30 = iVar6 * lVar32;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar30;
          uVar20 = SUB168(auVar3 * ZEXT816(0x18),0);
          uVar39 = uVar20 + 8;
          if (0xfffffffffffffff7 < uVar20) {
            uVar39 = 0xffffffffffffffff;
          }
          uVar20 = 0xffffffffffffffff;
          if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
            uVar20 = uVar39;
          }
          local_1e0 = (ulong *)operator_new__(uVar20);
          *local_1e0 = uVar30;
          pAVar36 = (Array2D<Imf_3_2::Rgba> *)(local_1e0 + 1);
          if (uVar30 != 0) {
            memset(pAVar36,0,((uVar30 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
          }
          local_1e8 = (Array2D<Imf_3_2::Rgba> *)(lVar32 * 0x18);
          local_200 = (Rgba *)0x0;
          local_1f0 = pAVar36;
          while (iVar6 = Imf_3_2::TiledRgbaOutputFile::numYLevels(), (long)local_200 < (long)iVar6)
          {
            pAVar26 = local_1f0;
            for (lVar41 = 0; iVar6 = Imf_3_2::TiledRgbaOutputFile::numXLevels(), lVar41 < iVar6;
                lVar41 = lVar41 + 1) {
              iVar8 = (int)(Rgba *)&out;
              iVar6 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar8);
              iVar7 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar8);
              uVar39 = (long)iVar7 * (long)iVar6;
              uVar20 = uVar39 * 8;
              if (0x1fffffffffffffff < uVar39) {
                uVar20 = 0xffffffffffffffff;
              }
              pRVar13 = (Rgba *)operator_new__(uVar20);
              if (pAVar26->_data != (Rgba *)0x0) {
                operator_delete__(pAVar26->_data);
              }
              pAVar26->_sizeX = (long)iVar7;
              pAVar26->_sizeY = (long)iVar6;
              pAVar26->_data = pRVar13;
              fillPixels(pAVar26,iVar6,iVar7);
              Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pAVar26->_data,1);
              iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar8);
              iVar7 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar8);
              Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar8,0,iVar6 + -1,0,iVar7 + -1,(int)lVar41);
              pAVar26 = pAVar26 + 1;
            }
            local_200 = (Rgba *)((long)local_200 + 1);
            local_1f0 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1f0->_sizeX + (long)local_1e8);
          }
          Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
          std::ostream::flush();
          iVar6 = Imf_3_2::globalThreadCount();
          Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&out,_Var5._M_p,iVar6);
          piVar14 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
          local_1e8 = (Array2D<Imf_3_2::Rgba> *)(long)*piVar14;
          iVar6 = piVar14[1];
          local_1f4 = Imf_3_2::TiledRgbaInputFile::numXLevels();
          uVar38 = Imf_3_2::TiledRgbaInputFile::numYLevels();
          lVar41 = (long)(int)local_1f4;
          RVar31 = (Rgba)((int)uVar38 * lVar41);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = RVar31;
          uVar20 = SUB168(auVar4 * ZEXT816(0x18),0);
          bVar43 = SUB168(auVar4 * ZEXT816(0x18),8) != 0;
          pAVar26 = (Array2D<Imf_3_2::Rgba> *)(ulong)bVar43;
          uVar39 = uVar20 + 8;
          if (0xfffffffffffffff7 < uVar20) {
            uVar39 = 0xffffffffffffffff;
          }
          uVar20 = 0xffffffffffffffff;
          if (!bVar43) {
            uVar20 = uVar39;
          }
          local_200 = (Rgba *)operator_new__(uVar20);
          *local_200 = RVar31;
          pRVar13 = local_200 + 1;
          if (RVar31 != (Rgba)0x0) {
            pAVar26 = (Array2D<Imf_3_2::Rgba> *)0xaaaaaaaaaaaaaaab;
            memset(pRVar13,0,(((long)RVar31 * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
          }
          uVar39 = (ulong)local_1f4;
          uVar20 = uVar39;
          if (0 < (int)uVar38) {
            local_1e8 = (Array2D<Imf_3_2::Rgba> *)-(long)local_1e8;
            local_d0 = local_200 + 3;
            local_1f0 = (Array2D<Imf_3_2::Rgba> *)0x0;
            do {
              if (0 < (int)uVar20) {
                uVar30 = 0;
                pRVar37 = local_d0;
                do {
                  iVar58 = (int)(Rgba *)&out;
                  iVar7 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar58);
                  iVar8 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar58);
                  RVar31 = (Rgba)(long)iVar7;
                  uVar23 = (long)iVar8 * (long)RVar31;
                  uVar20 = uVar23 * 8;
                  if (0x1fffffffffffffff < uVar23) {
                    uVar20 = 0xffffffffffffffff;
                  }
                  RVar24 = (Rgba)operator_new__(uVar20);
                  if (*pRVar37 != (Rgba)0x0) {
                    operator_delete__((void *)*pRVar37);
                  }
                  pRVar37[-2] = (Rgba)(long)iVar8;
                  pRVar37[-1] = RVar31;
                  *pRVar37 = RVar24;
                  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                            ((Rgba *)&out,
                             (ulong)((long)((long)RVar31 * -(long)iVar6 * 8 + (long)RVar24) +
                                    (long)local_1e8 * 8),1);
                  iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar58);
                  iVar8 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar58);
                  Imf_3_2::TiledRgbaInputFile::readTiles
                            (iVar58,0,iVar7 + -1,0,iVar8 + -1,(int)uVar30);
                  uVar30 = uVar30 + 1;
                  pRVar37 = pRVar37 + 3;
                  uVar20 = (ulong)local_1f4;
                } while (uVar39 != uVar30);
              }
              pAVar26 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1f0->_sizeX + 1);
              local_d0 = local_d0 + lVar41 * 3;
              local_1f0 = pAVar26;
            } while (pAVar26 != (Array2D<Imf_3_2::Rgba> *)(ulong)uVar38);
          }
          uVar44 = SUB84(pAVar26,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          std::ostream::flush();
          puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
          puVar17 = (undefined8 *)Imf_3_2::Header::displayWindow();
          iVar6 = -(uint)((int)*puVar17 == (int)*puVar16);
          iVar7 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
          auVar54._4_4_ = iVar6;
          auVar54._0_4_ = iVar6;
          auVar54._8_4_ = iVar7;
          auVar54._12_4_ = iVar7;
          iVar6 = movmskpd(uVar44,auVar54);
          if ((iVar6 != 3) ||
             (iVar7 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
             iVar8 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
             auVar55._4_4_ = iVar7, auVar55._0_4_ = iVar7, auVar55._8_4_ = iVar8,
             auVar55._12_4_ = iVar8, iVar7 = movmskpd((int)puVar17,auVar55), iVar7 != 3)) {
            __assert_fail("in.displayWindow () == header.displayWindow ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x182,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          puVar16 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
          puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
          iVar7 = -(uint)((int)*puVar17 == (int)*puVar16);
          iVar8 = -(uint)((int)((ulong)*puVar17 >> 0x20) == (int)((ulong)*puVar16 >> 0x20));
          auVar56._4_4_ = iVar7;
          auVar56._0_4_ = iVar7;
          auVar56._8_4_ = iVar8;
          auVar56._12_4_ = iVar8;
          iVar6 = movmskpd(iVar6,auVar56);
          if ((iVar6 != 3) ||
             (iVar6 = -(uint)((int)puVar17[1] == (int)puVar16[1]),
             iVar7 = -(uint)((int)((ulong)puVar17[1] >> 0x20) == (int)((ulong)puVar16[1] >> 0x20)),
             auVar57._4_4_ = iVar6, auVar57._0_4_ = iVar6, auVar57._8_4_ = iVar7,
             auVar57._12_4_ = iVar7, iVar6 = movmskpd((int)puVar17,auVar57), iVar6 != 3)) {
            __assert_fail("in.dataWindow () == header.dataWindow ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x183,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          fVar45 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
          local_1f0._0_4_ = fVar45;
          pfVar18 = (float *)Imf_3_2::Header::pixelAspectRatio();
          if ((local_1f0._0_4_ != *pfVar18) || (NAN(local_1f0._0_4_) || NAN(*pfVar18))) {
            __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x184,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
          pfVar18 = (float *)Imf_3_2::Header::screenWindowCenter();
          if (((float)p1._sizeX == *pfVar18) && (!NAN((float)p1._sizeX) && !NAN(*pfVar18))) {
            if ((p1._sizeX._4_4_ == pfVar18[1]) && (!NAN(p1._sizeX._4_4_) && !NAN(pfVar18[1]))) {
              uVar44 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
              local_1f0 = (Array2D<Imf_3_2::Rgba> *)CONCAT44(local_1f0._4_4_,uVar44);
              pfVar18 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((local_1f0._0_4_ != *pfVar18) || (NAN(local_1f0._0_4_) || NAN(*pfVar18))) {
                __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x186,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar6 = Imf_3_2::TiledRgbaInputFile::lineOrder();
              piVar14 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar6 != *piVar14) {
                __assert_fail("in.lineOrder () == header.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x187,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar6 = Imf_3_2::TiledRgbaInputFile::compression();
              piVar14 = (int *)Imf_3_2::Header::compression();
              if (iVar6 != *piVar14) {
                __assert_fail("in.compression () == header.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x188,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar6 = Imf_3_2::TiledRgbaInputFile::channels();
              if (iVar6 != 0xf) {
                __assert_fail("in.channels () == channels",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x189,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              if (0 < (int)uVar38) {
                local_1e8 = (Array2D<Imf_3_2::Rgba> *)0x0;
                do {
                  if (0 < (int)uVar20) {
                    lVar27 = (long)local_1e8 * lVar41;
                    lVar33 = (long)local_1e8 * lVar32;
                    uVar20 = 0;
                    do {
                      lVar29 = 0;
                      pvVar15 = (void *)0x0;
                      while( true ) {
                        iVar6 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                        if ((long)iVar6 <= (long)pvVar15) break;
                        lVar42 = 0;
                        local_1f0 = (Array2D<Imf_3_2::Rgba> *)pvVar15;
                        while (iVar6 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out),
                              lVar42 < iVar6) {
                          lVar34 = (long)pRVar13[lVar27 * 3 + uVar20 * 3 + 1] * lVar29 +
                                   (long)pRVar13[lVar27 * 3 + uVar20 * 3 + 2];
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + lVar42 * 8) * 4);
                          lVar35 = pAVar36[lVar33 + uVar20]._sizeY * lVar29;
                          pRVar37 = pAVar36[lVar33 + uVar20]._data;
                          pfVar18 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar37[lVar42].r._h + lVar35) * 4);
                          if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                            __assert_fail("(levels2[ly][lx])[y][x].r == (levels[ly][lx])[y][x].r",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x196,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 2 + lVar42 * 8) * 4);
                          pfVar18 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar37[lVar42].g._h + lVar35) * 4);
                          if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                            __assert_fail("(levels2[ly][lx])[y][x].g == (levels[ly][lx])[y][x].g",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x19d,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 4 + lVar42 * 8) * 4);
                          pfVar18 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar37[lVar42].b._h + lVar35) * 4);
                          if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                            __assert_fail("(levels2[ly][lx])[y][x].b == (levels[ly][lx])[y][x].b",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x1a4,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar45 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 6 + lVar42 * 8) * 4);
                          pRVar37 = pRVar37 + lVar42;
                          lVar42 = lVar42 + 1;
                          pfVar18 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)((long)&(pRVar37->a)._h + lVar35) *
                                             4);
                          if ((fVar45 != *pfVar18) || (NAN(fVar45) || NAN(*pfVar18))) {
                            __assert_fail("(levels2[ly][lx])[y][x].a == (levels[ly][lx])[y][x].a",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x1ab,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                        }
                        pvVar15 = (void *)((long)local_1f0 + 1);
                        lVar29 = lVar29 + 8;
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != uVar39);
                  }
                  local_1e8 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1e8->_sizeX + 1);
                  uVar20 = (ulong)local_1f4;
                } while (local_1e8 != (Array2D<Imf_3_2::Rgba> *)(ulong)uVar38);
              }
              if (pRVar13 != (Rgba *)0x0) {
                RVar31 = *local_200;
                if (RVar31 != (Rgba)0x0) {
                  lVar32 = (long)RVar31 * 0x18;
                  do {
                    pvVar15 = *(void **)((long)&(local_200->r)._h + lVar32);
                    if (pvVar15 != (void *)0x0) {
                      operator_delete__(pvVar15);
                    }
                    lVar32 = lVar32 + -0x18;
                  } while (lVar32 != 0);
                }
                operator_delete__(local_200,(long)RVar31 * 0x18 + 8);
              }
              Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
              remove(_Var5._M_p);
              puVar21 = local_1e0;
              if (pAVar36 != (Array2D<Imf_3_2::Rgba> *)0x0) {
                uVar20 = *local_1e0;
                if (uVar20 != 0) {
                  lVar32 = uVar20 * 0x18;
                  do {
                    pvVar15 = *(void **)((long)puVar21 + lVar32);
                    if (pvVar15 != (void *)0x0) {
                      operator_delete__(pvVar15);
                    }
                    lVar32 = lVar32 + -0x18;
                  } while (lVar32 != 0);
                }
                operator_delete__(puVar21,uVar20 * 0x18 + 8);
              }
              Imf_3_2::Header::~Header(&header);
              goto LAB_001b6afe;
            }
          }
          __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x185,
                        "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                       );
        }
      }
      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x106,
                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                   );
    }
  }
  __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                ,0x69,
                "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
               );
}

Assistant:

void
writeRead (
    const std::string& tempDir,
    int                W,
    int                H,
    Compression        comp,
    int                xSize,
    int                ySize)
{
    std::string filename = tempDir + "imf_test_tiled_rgba.exr";

    writeReadRGBAONE (filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

    if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION &&
        comp != DWAA_COMPRESSION && comp != DWAB_COMPRESSION)
    {
        //
        // Skip mipmaps and ripmaps with B44 or DWA compression; writing
        // an image with a single resolution level, above, should be enough
        // to verify that B44 and DWA compression work with tiled files.
        //

        writeReadRGBAMIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

        writeReadRGBARIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);
    }
}